

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O2

OpCode __thiscall ByteCodeGenerator::ToChkUndeclOp(ByteCodeGenerator *this,OpCode op)

{
  code *pcVar1;
  int iVar2;
  bool bVar3;
  OpCode OVar4;
  undefined4 *puVar5;
  undefined6 in_register_00000032;
  
  iVar2 = (int)CONCAT62(in_register_00000032,op);
  switch(iVar2) {
  case 0x142:
    OVar4 = StParamSlotChkUndecl;
    break;
  case 0x147:
    OVar4 = StObjSlotChkUndecl;
    break;
  case 0x148:
    OVar4 = StInnerObjSlotChkUndecl;
    break;
  case 0x149:
    OVar4 = StLocalObjSlotChkUndecl;
    break;
  case 0x14a:
    OVar4 = StParamObjSlotChkUndecl;
    break;
  case 0x14d:
    OVar4 = StEnvObjSlotChkUndecl;
    break;
  default:
    if (iVar2 == 0x94) {
      return StEnvSlotChkUndecl;
    }
    if (iVar2 == 0x95) {
      return StInnerSlotChkUndecl;
    }
    if (iVar2 == 0x96) {
      return StLocalSlotChkUndecl;
    }
  case 0x143:
  case 0x144:
  case 0x145:
  case 0x146:
  case 0x14b:
  case 0x14c:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x131,"(false)","Unknown opcode for chk undecl mapping");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
    OVar4 = InvalidOpCode;
  }
  return OVar4;
}

Assistant:

Js::OpCode ByteCodeGenerator::ToChkUndeclOp(Js::OpCode op) const
{
    switch (op)
    {
    case Js::OpCode::StLocalSlot:
        return Js::OpCode::StLocalSlotChkUndecl;

    case Js::OpCode::StParamSlot:
        return Js::OpCode::StParamSlotChkUndecl;

    case Js::OpCode::StInnerSlot:
        return Js::OpCode::StInnerSlotChkUndecl;

    case Js::OpCode::StEnvSlot:
        return Js::OpCode::StEnvSlotChkUndecl;

    case Js::OpCode::StObjSlot:
        return Js::OpCode::StObjSlotChkUndecl;

    case Js::OpCode::StLocalObjSlot:
        return Js::OpCode::StLocalObjSlotChkUndecl;

    case Js::OpCode::StParamObjSlot:
        return Js::OpCode::StParamObjSlotChkUndecl;

    case Js::OpCode::StInnerObjSlot:
        return Js::OpCode::StInnerObjSlotChkUndecl;

    case Js::OpCode::StEnvObjSlot:
        return Js::OpCode::StEnvObjSlotChkUndecl;

    default:
        AssertMsg(false, "Unknown opcode for chk undecl mapping");
        return Js::OpCode::InvalidOpCode;
    }
}